

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O3

void __thiscall
dg::debug::DG2Dot<dg::LLVMNode>::dump_parameters
          (DG2Dot<dg::LLVMNode> *this,DGParameters<dg::LLVMNode> *params,int ind,bool formal)

{
  LLVMNode *pLVar1;
  LLVMNode *node;
  undefined8 *puVar2;
  _Rb_tree_node_base *p_Var3;
  char *pcVar4;
  char *pcVar5;
  
  p_Var3 = *(_Rb_tree_node_base **)(params + 0x48);
  if (p_Var3 != (_Rb_tree_node_base *)(params + 0x38)) {
    pcVar4 = "IN ARG";
    if (formal) {
      pcVar4 = "[f] IN ARG";
    }
    pcVar5 = "OUT ARG";
    if (formal) {
      pcVar5 = "[f] OUT ARG";
    }
    do {
      pLVar1 = (LLVMNode *)p_Var3[1]._M_parent;
      node = (LLVMNode *)p_Var3[1]._M_left;
      if (pLVar1 == (LLVMNode *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->out,"NO IN ARG",9);
      }
      else {
        dump_node(this,pLVar1,ind,pcVar4);
        dump_node_edges(this,pLVar1,ind);
      }
      if (node == (LLVMNode *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->out,"NO OUT ARG",10);
      }
      else {
        dump_node(this,node,ind,pcVar5);
        dump_node_edges(this,node,ind);
      }
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != (_Rb_tree_node_base *)(params + 0x38));
  }
  p_Var3 = *(_Rb_tree_node_base **)(params + 0x18);
  if (p_Var3 != (_Rb_tree_node_base *)(params + 8)) {
    pcVar4 = "GLOB IN";
    if (formal) {
      pcVar4 = "[f] GLOB IN";
    }
    pcVar5 = "GLOB OUT";
    if (formal) {
      pcVar5 = "[f] GLOB OUT";
    }
    do {
      if ((LLVMNode *)p_Var3[1]._M_parent == (LLVMNode *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&this->out,"NO GLOB IN ARG",0xe);
      }
      else {
        dump_node(this,(LLVMNode *)p_Var3[1]._M_parent,ind,pcVar4);
        dump_node_edges(this,(LLVMNode *)p_Var3[1]._M_parent,ind);
      }
      if ((LLVMNode *)p_Var3[1]._M_left == (LLVMNode *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&this->out,"NO GLOB OUT ARG",0xf);
      }
      else {
        dump_node(this,(LLVMNode *)p_Var3[1]._M_left,ind,pcVar5);
        dump_node_edges(this,(LLVMNode *)p_Var3[1]._M_left,ind);
      }
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != (_Rb_tree_node_base *)(params + 8));
  }
  puVar2 = *(undefined8 **)(params + 0x60);
  if (puVar2 != (undefined8 *)0x0) {
    if ((LLVMNode *)*puVar2 == (LLVMNode *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->out,"NO IN va ARG",0xc);
    }
    else {
      dump_node(this,(LLVMNode *)*puVar2,ind,"[va] IN ARG");
      dump_node_edges(this,(LLVMNode *)*puVar2,ind);
    }
    if ((LLVMNode *)puVar2[1] == (LLVMNode *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->out,"NO OUT ARG",10);
    }
    else {
      dump_node(this,(LLVMNode *)puVar2[1],ind,"[va] OUT ARG");
      dump_node_edges(this,(LLVMNode *)puVar2[1],ind);
    }
  }
  pLVar1 = *(LLVMNode **)(params + 0x68);
  if (pLVar1 == (LLVMNode *)0x0) {
    return;
  }
  dump_node(this,pLVar1,ind,"[noret]");
  dump_node_edges(this,pLVar1,ind);
  return;
}

Assistant:

void dump_parameters(DGParameters<NodeT> *params, int ind, bool formal) {
        Indent Ind(ind);

        // FIXME
        // out << Ind << "/* Input parameters */\n";
        // dumpBB(params->getBBIn(), data);
        // out << Ind << "/* Output parameters */\n";
        // dumpBB(params->getBBOut(), data);

        // dump all the nodes again to get the names
        for (auto it : *params) {
            auto &p = it.second;
            if (p.in) {
                dump_node(p.in, ind, formal ? "[f] IN ARG" : "IN ARG");
                dump_node_edges(p.in, ind);
            } else
                out << "NO IN ARG";

            if (p.out) {
                dump_node(p.out, ind, formal ? "[f] OUT ARG" : "OUT ARG");
                dump_node_edges(p.out, ind);
            } else
                out << "NO OUT ARG";
        }

        for (auto I = params->global_begin(), E = params->global_end(); I != E;
             ++I) {
            auto &p = I->second;
            if (p.in) {
                dump_node(p.in, ind, formal ? "[f] GLOB IN" : "GLOB IN");
                dump_node_edges(p.in, ind);
            } else
                out << "NO GLOB IN ARG";

            if (p.out) {
                dump_node(p.out, ind, formal ? "[f] GLOB OUT" : "GLOB OUT");
                dump_node_edges(p.out, ind);
            } else
                out << "NO GLOB OUT ARG";
        }

        auto p = params->getVarArg();
        if (p) {
            if (p->in) {
                dump_node(p->in, ind, "[va] IN ARG");
                dump_node_edges(p->in, ind);
            } else
                out << "NO IN va ARG";

            if (p->out) {
                dump_node(p->out, ind, "[va] OUT ARG");
                dump_node_edges(p->out, ind);
            } else
                out << "NO OUT ARG";
        }

        if (auto *noret = params->getNoReturn()) {
            dump_node(noret, ind, "[noret]");
            dump_node_edges(noret, ind);
        }
    }